

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase164::run(TestCase164 *this)

{
  bool bVar1;
  anon_class_1_0_00000001 *extraout_RDX;
  anon_class_1_0_00000001 *extraout_RDX_00;
  anon_class_1_0_00000001 *func;
  anon_class_1_0_00000001 *extraout_RDX_01;
  anon_class_1_0_00000001 *func_00;
  anon_class_1_0_00000001 *func_01;
  anon_class_1_0_00000001 *func_02;
  anon_class_8_1_6b0526df *extraout_RDX_02;
  anon_class_8_1_6b0526df *extraout_RDX_03;
  anon_class_8_1_6b0526df *extraout_RDX_04;
  anon_class_8_1_6b0526df *func_03;
  anon_class_8_1_6b0526df *func_04;
  anon_class_8_1_6b0526df *extraout_RDX_05;
  anon_class_8_1_6b0526df *extraout_RDX_06;
  anon_class_8_1_6b0526df *extraout_RDX_07;
  anon_class_8_1_6b0526df *func_05;
  anon_class_8_1_6b0526df *func_06;
  anon_class_8_1_6b0526df *extraout_RDX_08;
  anon_class_8_1_6b0526df *extraout_RDX_09;
  anon_class_8_1_6b0526df *extraout_RDX_10;
  anon_class_8_1_6b0526df *func_07;
  anon_class_8_1_6b0526df *func_08;
  anon_class_8_1_6b0526df *extraout_RDX_11;
  anon_class_8_1_6b0526df *extraout_RDX_12;
  anon_class_8_1_6b0526df *extraout_RDX_13;
  anon_class_8_1_6b0526df *func_09;
  anon_class_8_1_6b0526df *func_10;
  anon_class_8_1_6b0526df *extraout_RDX_14;
  anon_class_8_1_6b0526df *extraout_RDX_15;
  anon_class_8_1_6b0526df *paVar2;
  anon_class_8_1_6b0526df *extraout_RDX_16;
  anon_class_8_1_6b0526df *func_11;
  anon_class_8_1_6b0526df *func_12;
  bool local_65e1;
  Schema SStack_65e0;
  bool _kj_shouldLog_44;
  Schema local_65d8;
  EnumSchema local_65d0;
  undefined1 local_65c8 [8];
  DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> _kjCondition_44;
  bool local_6597;
  Which local_6596 [2];
  DebugExpression<capnp::schema::Type::Which> local_6592;
  undefined1 local_6590;
  bool _kj_shouldLog_43;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_43;
  ListSchema inner_2;
  undefined1 auStack_6558 [7];
  bool _kj_shouldLog_42;
  Maybe<kj::Exception> local_6550;
  DebugExpression<kj::Maybe<kj::Exception>_> local_63b8;
  undefined1 local_6220 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_42;
  undefined1 auStack_6060 [7];
  bool _kj_shouldLog_41;
  Maybe<kj::Exception> local_6058;
  DebugExpression<kj::Maybe<kj::Exception>_> local_5ec0;
  undefined1 local_5d28 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_41;
  undefined1 auStack_5b68 [7];
  bool _kj_shouldLog_40;
  Maybe<kj::Exception> local_5b60;
  DebugExpression<kj::Maybe<kj::Exception>_> local_59c8;
  undefined1 local_5830 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_40;
  bool local_566f;
  Which local_566e;
  Which local_566c;
  DebugExpression<capnp::schema::Type::Which> local_566a;
  undefined1 local_5668;
  bool _kj_shouldLog_39;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_39;
  ListSchema schema_4;
  Schema SStack_5630;
  bool _kj_shouldLog_38;
  Schema local_5628;
  StructSchema local_5620;
  undefined1 local_5618 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema> _kjCondition_38;
  bool local_55e7;
  Which local_55e6;
  Which local_55e4;
  DebugExpression<capnp::schema::Type::Which> local_55e2;
  undefined1 local_55e0;
  bool _kj_shouldLog_37;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_37;
  ListSchema inner_1;
  undefined1 auStack_55a8 [7];
  bool _kj_shouldLog_36;
  Maybe<kj::Exception> local_55a0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_5408;
  undefined1 local_5270 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_36;
  undefined1 auStack_50b0 [7];
  bool _kj_shouldLog_35;
  Maybe<kj::Exception> local_50a8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_4f10;
  undefined1 local_4d78 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_35;
  undefined1 auStack_4bb8 [7];
  bool _kj_shouldLog_34;
  Maybe<kj::Exception> local_4bb0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_4a18;
  undefined1 local_4880 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_34;
  bool local_46bf;
  Which local_46be;
  Which local_46bc;
  DebugExpression<capnp::schema::Type::Which> local_46ba;
  undefined1 local_46b8;
  bool _kj_shouldLog_33;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_33;
  ListSchema schema_3;
  bool local_467f;
  Which local_467e;
  Which local_467c;
  DebugExpression<capnp::schema::Type::Which> local_467a;
  undefined1 local_4678;
  bool _kj_shouldLog_32;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_32;
  ListSchema inner;
  undefined1 auStack_4640 [7];
  bool _kj_shouldLog_31;
  Maybe<kj::Exception> local_4638;
  DebugExpression<kj::Maybe<kj::Exception>_> local_44a0;
  undefined1 local_4308 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_31;
  undefined1 auStack_4148 [7];
  bool _kj_shouldLog_30;
  Maybe<kj::Exception> local_4140;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3fa8;
  undefined1 local_3e10 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_30;
  undefined1 auStack_3c50 [7];
  bool _kj_shouldLog_29;
  Maybe<kj::Exception> local_3c48;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3ab0;
  undefined1 local_3918 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_29;
  bool local_3757;
  Which local_3756;
  Which local_3754;
  DebugExpression<capnp::schema::Type::Which> local_3752;
  undefined1 local_3750;
  bool _kj_shouldLog_28;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_28;
  ListSchema schema_2;
  undefined1 auStack_3718 [7];
  bool _kj_shouldLog_27;
  Maybe<kj::Exception> local_3710;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3578;
  undefined1 local_33e0 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_27;
  undefined1 auStack_3220 [7];
  bool _kj_shouldLog_26;
  Maybe<kj::Exception> local_3218;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3080;
  undefined1 local_2ee8 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_26;
  undefined1 auStack_2d28 [7];
  bool _kj_shouldLog_25;
  Maybe<kj::Exception> local_2d20;
  DebugExpression<kj::Maybe<kj::Exception>_> local_2b88;
  undefined1 local_29f0 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_25;
  Schema SStack_2830;
  bool _kj_shouldLog_24;
  Schema local_2828;
  EnumSchema local_2820;
  undefined1 local_2818 [8];
  DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> _kjCondition_24;
  bool local_27e7;
  Which local_27e6;
  Which local_27e4;
  DebugExpression<capnp::schema::Type::Which> local_27e2;
  undefined1 local_27e0;
  bool _kj_shouldLog_23;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_23;
  ListSchema schema_1;
  undefined1 auStack_27a8 [7];
  bool _kj_shouldLog_22;
  Maybe<kj::Exception> local_27a0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_2608;
  undefined1 local_2470 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_22;
  undefined1 auStack_22b0 [7];
  bool _kj_shouldLog_21;
  Maybe<kj::Exception> local_22a8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_2110;
  undefined1 local_1f78 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_21;
  undefined1 auStack_1db8 [7];
  bool _kj_shouldLog_20;
  Maybe<kj::Exception> local_1db0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_1c18;
  undefined1 local_1a80 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_20;
  Schema SStack_18c0;
  bool _kj_shouldLog_19;
  Schema local_18b8;
  StructSchema local_18b0;
  undefined1 local_18a8 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema> _kjCondition_19;
  bool local_1877;
  Which local_1876;
  Which local_1874;
  DebugExpression<capnp::schema::Type::Which> local_1872;
  undefined1 local_1870;
  bool _kj_shouldLog_18;
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_18;
  ListSchema schema;
  undefined1 local_1838 [6];
  bool _kj_shouldLog_17;
  DebugExpression<kj::Maybe<kj::Exception>_> local_16a0;
  undefined1 local_1508 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_17;
  undefined1 local_1348 [6];
  bool _kj_shouldLog_16;
  DebugExpression<kj::Maybe<kj::Exception>_> local_11b0;
  undefined1 local_1018 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_16;
  undefined1 local_e58 [6];
  bool _kj_shouldLog_15;
  DebugExpression<kj::Maybe<kj::Exception>_> local_cc0;
  undefined1 local_b28 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_15;
  bool _kj_shouldLog_14;
  undefined1 local_959 [409];
  DebugExpression<kj::Maybe<kj::Exception>_> local_7c0;
  undefined1 local_628 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_14;
  Which local_45e;
  Which local_45c;
  bool local_459;
  undefined1 auStack_458 [7];
  bool _kj_shouldLog_13;
  Which local_446;
  Which local_444;
  DebugExpression<capnp::schema::Type::Which> local_442;
  undefined1 local_440 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_13;
  Which local_40e;
  Which local_40c;
  bool local_409;
  undefined1 auStack_408 [7];
  bool _kj_shouldLog_12;
  Which local_3f6;
  Which local_3f4;
  DebugExpression<capnp::schema::Type::Which> local_3f2;
  undefined1 local_3f0 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_12;
  Which local_3be;
  Which local_3bc;
  bool local_3b9;
  undefined1 auStack_3b8 [7];
  bool _kj_shouldLog_11;
  Which local_3a6 [2];
  DebugExpression<capnp::schema::Type::Which> local_3a2;
  undefined1 local_3a0 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_11;
  Which local_36e [2];
  bool local_369;
  undefined1 auStack_368 [7];
  bool _kj_shouldLog_10;
  Which local_356 [2];
  DebugExpression<capnp::schema::Type::Which> local_352;
  undefined1 local_350 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_10;
  Which local_31e [2];
  bool local_319;
  undefined1 auStack_318 [7];
  bool _kj_shouldLog_9;
  Which local_306 [2];
  DebugExpression<capnp::schema::Type::Which> local_302;
  undefined1 local_300 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_9;
  Which local_2ce;
  Which local_2cc;
  bool local_2c9;
  undefined1 auStack_2c8 [7];
  bool _kj_shouldLog_8;
  Which local_2b6;
  Which local_2b4;
  DebugExpression<capnp::schema::Type::Which> local_2b2;
  undefined1 local_2b0 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_8;
  Which local_27e;
  Which local_27c;
  bool local_279;
  undefined1 auStack_278 [7];
  bool _kj_shouldLog_7;
  Which local_266;
  Which local_264;
  DebugExpression<capnp::schema::Type::Which> local_262;
  undefined1 local_260 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_7;
  Which local_22e;
  Which local_22c;
  bool local_229;
  undefined1 auStack_228 [7];
  bool _kj_shouldLog_6;
  Which local_216;
  Which local_214;
  DebugExpression<capnp::schema::Type::Which> local_212;
  undefined1 local_210 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_6;
  Which local_1de [2];
  bool local_1d9;
  undefined1 auStack_1d8 [7];
  bool _kj_shouldLog_5;
  Which local_1c6 [2];
  DebugExpression<capnp::schema::Type::Which> local_1c2;
  undefined1 local_1c0 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_5;
  Which local_18e [2];
  bool local_189;
  undefined1 auStack_188 [7];
  bool _kj_shouldLog_4;
  Which local_176 [2];
  DebugExpression<capnp::schema::Type::Which> local_172;
  undefined1 local_170 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_4;
  Which local_13e;
  Which local_13c;
  bool local_139;
  undefined1 auStack_138 [7];
  bool _kj_shouldLog_3;
  Which local_126;
  Which local_124;
  DebugExpression<capnp::schema::Type::Which> local_122;
  undefined1 local_120 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_3;
  Which local_ee;
  Which local_ec;
  bool local_e9;
  undefined1 auStack_e8 [7];
  bool _kj_shouldLog_2;
  Which local_d6;
  Which local_d4;
  DebugExpression<capnp::schema::Type::Which> local_d2;
  undefined1 local_d0 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_2;
  Which local_9e;
  Which local_9c;
  bool local_99;
  undefined1 auStack_98 [7];
  bool _kj_shouldLog_1;
  Which local_86;
  Which local_84;
  DebugExpression<capnp::schema::Type::Which> local_82;
  undefined1 local_80 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition_1;
  Which local_4e;
  Which local_4c;
  bool local_49;
  undefined1 auStack_48 [7];
  bool _kj_shouldLog;
  Which local_36 [2];
  DebugExpression<capnp::schema::Type::Which> local_32;
  undefined1 local_30 [8];
  DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> _kjCondition;
  TestCase164 *this_local;
  
  local_36[1] = 0;
  _kjCondition._24_8_ = this;
  local_32 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_36 + 1);
  _auStack_48 = (Type)Schema::from<capnp::List<capnp::Void,(capnp::Kind)0>>();
  local_36[0] = ListSchema::whichElementType((ListSchema *)auStack_48);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_30,
             &local_32,local_36);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    local_49 = kj::_::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      local_4c._0_1_ = '\0';
      local_4c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<capnp::Void,(capnp::Kind)0>>();
      local_4e = ListSchema::whichElementType((ListSchema *)&_kjCondition_1.result);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xa5,ERROR,
                 "\"failed: expected \" \"(schema::Type::VOID) == (Schema::from<List<Void>>().whichElementType())\", _kjCondition, schema::Type::VOID, Schema::from<List<Void>>().whichElementType()"
                 ,(char (*) [89])
                  "failed: expected (schema::Type::VOID) == (Schema::from<List<Void>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_30,&local_4c,&local_4e);
      local_49 = false;
    }
  }
  local_84._0_1_ = '\x01';
  local_84._1_1_ = '\0';
  local_82 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_84);
  _auStack_98 = (Type)Schema::from<capnp::List<bool,(capnp::Kind)0>>();
  local_86 = ListSchema::whichElementType((ListSchema *)auStack_98);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_80,
             &local_82,&local_86);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar1) {
    local_99 = kj::_::Debug::shouldLog(ERROR);
    while (local_99 != false) {
      local_9c._0_1_ = '\x01';
      local_9c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<bool,(capnp::Kind)0>>();
      local_9e = ListSchema::whichElementType((ListSchema *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xa6,ERROR,
                 "\"failed: expected \" \"(schema::Type::BOOL) == (Schema::from<List<bool>>().whichElementType())\", _kjCondition, schema::Type::BOOL, Schema::from<List<bool>>().whichElementType()"
                 ,(char (*) [89])
                  "failed: expected (schema::Type::BOOL) == (Schema::from<List<bool>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_80,&local_9c,&local_9e);
      local_99 = false;
    }
  }
  local_d4._0_1_ = '\x02';
  local_d4._1_1_ = '\0';
  local_d2 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d4);
  _auStack_e8 = (Type)Schema::from<capnp::List<signed_char,(capnp::Kind)0>>();
  local_d6 = ListSchema::whichElementType((ListSchema *)auStack_e8);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_d0,
             &local_d2,&local_d6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
  if (!bVar1) {
    local_e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_e9 != false) {
      local_ec._0_1_ = '\x02';
      local_ec._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<signed_char,(capnp::Kind)0>>();
      local_ee = ListSchema::whichElementType((ListSchema *)&_kjCondition_3.result);
      kj::_::Debug::
      log<char_const(&)[91],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xa7,ERROR,
                 "\"failed: expected \" \"(schema::Type::INT8) == (Schema::from<List<int8_t>>().whichElementType())\", _kjCondition, schema::Type::INT8, Schema::from<List<int8_t>>().whichElementType()"
                 ,(char (*) [91])
                  "failed: expected (schema::Type::INT8) == (Schema::from<List<int8_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_d0,&local_ec,&local_ee);
      local_e9 = false;
    }
  }
  local_124._0_1_ = '\x03';
  local_124._1_1_ = '\0';
  local_122 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_124);
  _auStack_138 = (Type)Schema::from<capnp::List<short,(capnp::Kind)0>>();
  local_126 = ListSchema::whichElementType((ListSchema *)auStack_138);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_120,
             &local_122,&local_126);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
  if (!bVar1) {
    local_139 = kj::_::Debug::shouldLog(ERROR);
    while (local_139 != false) {
      local_13c._0_1_ = '\x03';
      local_13c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<short,(capnp::Kind)0>>();
      local_13e = ListSchema::whichElementType((ListSchema *)&_kjCondition_4.result);
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xa8,ERROR,
                 "\"failed: expected \" \"(schema::Type::INT16) == (Schema::from<List<int16_t>>().whichElementType())\", _kjCondition, schema::Type::INT16, Schema::from<List<int16_t>>().whichElementType()"
                 ,(char (*) [93])
                  "failed: expected (schema::Type::INT16) == (Schema::from<List<int16_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_120,&local_13c,&local_13e);
      local_139 = false;
    }
  }
  local_176[1] = 4;
  local_172 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_176 + 1);
  _auStack_188 = (Type)Schema::from<capnp::List<int,(capnp::Kind)0>>();
  local_176[0] = ListSchema::whichElementType((ListSchema *)auStack_188);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_170,
             &local_172,local_176);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
  if (!bVar1) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      local_18e[1] = 4;
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<int,(capnp::Kind)0>>();
      local_18e[0] = ListSchema::whichElementType((ListSchema *)&_kjCondition_5.result);
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xa9,ERROR,
                 "\"failed: expected \" \"(schema::Type::INT32) == (Schema::from<List<int32_t>>().whichElementType())\", _kjCondition, schema::Type::INT32, Schema::from<List<int32_t>>().whichElementType()"
                 ,(char (*) [93])
                  "failed: expected (schema::Type::INT32) == (Schema::from<List<int32_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_170,local_18e + 1,local_18e);
      local_189 = false;
    }
  }
  local_1c6[1] = 5;
  local_1c2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_1c6 + 1);
  _auStack_1d8 = (Type)Schema::from<capnp::List<long,(capnp::Kind)0>>();
  local_1c6[0] = ListSchema::whichElementType((ListSchema *)auStack_1d8);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_1c0,
             &local_1c2,local_1c6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
  if (!bVar1) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      local_1de[1] = 5;
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<long,(capnp::Kind)0>>();
      local_1de[0] = ListSchema::whichElementType((ListSchema *)&_kjCondition_6.result);
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xaa,ERROR,
                 "\"failed: expected \" \"(schema::Type::INT64) == (Schema::from<List<int64_t>>().whichElementType())\", _kjCondition, schema::Type::INT64, Schema::from<List<int64_t>>().whichElementType()"
                 ,(char (*) [93])
                  "failed: expected (schema::Type::INT64) == (Schema::from<List<int64_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_1c0,local_1de + 1,local_1de);
      local_1d9 = false;
    }
  }
  local_214._0_1_ = '\x06';
  local_214._1_1_ = '\0';
  local_212 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_214);
  _auStack_228 = (Type)Schema::from<capnp::List<unsigned_char,(capnp::Kind)0>>();
  local_216 = ListSchema::whichElementType((ListSchema *)auStack_228);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_210,
             &local_212,&local_216);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
  if (!bVar1) {
    local_229 = kj::_::Debug::shouldLog(ERROR);
    while (local_229 != false) {
      local_22c._0_1_ = '\x06';
      local_22c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<unsigned_char,(capnp::Kind)0>>();
      local_22e = ListSchema::whichElementType((ListSchema *)&_kjCondition_7.result);
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xab,ERROR,
                 "\"failed: expected \" \"(schema::Type::UINT8) == (Schema::from<List<uint8_t>>().whichElementType())\", _kjCondition, schema::Type::UINT8, Schema::from<List<uint8_t>>().whichElementType()"
                 ,(char (*) [93])
                  "failed: expected (schema::Type::UINT8) == (Schema::from<List<uint8_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_210,&local_22c,&local_22e);
      local_229 = false;
    }
  }
  local_264._0_1_ = '\a';
  local_264._1_1_ = '\0';
  local_262 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_264);
  _auStack_278 = (Type)Schema::from<capnp::List<unsigned_short,(capnp::Kind)0>>();
  local_266 = ListSchema::whichElementType((ListSchema *)auStack_278);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_260,
             &local_262,&local_266);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
  if (!bVar1) {
    local_279 = kj::_::Debug::shouldLog(ERROR);
    while (local_279 != false) {
      local_27c._0_1_ = '\a';
      local_27c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<unsigned_short,(capnp::Kind)0>>()
      ;
      local_27e = ListSchema::whichElementType((ListSchema *)&_kjCondition_8.result);
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xac,ERROR,
                 "\"failed: expected \" \"(schema::Type::UINT16) == (Schema::from<List<uint16_t>>().whichElementType())\", _kjCondition, schema::Type::UINT16, Schema::from<List<uint16_t>>().whichElementType()"
                 ,(char (*) [95])
                  "failed: expected (schema::Type::UINT16) == (Schema::from<List<uint16_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_260,&local_27c,&local_27e);
      local_279 = false;
    }
  }
  local_2b4._0_1_ = '\b';
  local_2b4._1_1_ = '\0';
  local_2b2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2b4);
  _auStack_2c8 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  local_2b6 = ListSchema::whichElementType((ListSchema *)auStack_2c8);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_2b0,
             &local_2b2,&local_2b6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b0);
  if (!bVar1) {
    local_2c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c9 != false) {
      local_2cc._0_1_ = '\b';
      local_2cc._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
      local_2ce = ListSchema::whichElementType((ListSchema *)&_kjCondition_9.result);
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xad,ERROR,
                 "\"failed: expected \" \"(schema::Type::UINT32) == (Schema::from<List<uint32_t>>().whichElementType())\", _kjCondition, schema::Type::UINT32, Schema::from<List<uint32_t>>().whichElementType()"
                 ,(char (*) [95])
                  "failed: expected (schema::Type::UINT32) == (Schema::from<List<uint32_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_2b0,&local_2cc,&local_2ce);
      local_2c9 = false;
    }
  }
  local_306[1] = 9;
  local_302 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_306 + 1);
  _auStack_318 = (Type)Schema::from<capnp::List<unsigned_long,(capnp::Kind)0>>();
  local_306[0] = ListSchema::whichElementType((ListSchema *)auStack_318);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_300,
             &local_302,local_306);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_300);
  if (!bVar1) {
    local_319 = kj::_::Debug::shouldLog(ERROR);
    while (local_319 != false) {
      local_31e[1] = 9;
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<unsigned_long,(capnp::Kind)0>>();
      local_31e[0] = ListSchema::whichElementType((ListSchema *)&_kjCondition_10.result);
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xae,ERROR,
                 "\"failed: expected \" \"(schema::Type::UINT64) == (Schema::from<List<uint64_t>>().whichElementType())\", _kjCondition, schema::Type::UINT64, Schema::from<List<uint64_t>>().whichElementType()"
                 ,(char (*) [95])
                  "failed: expected (schema::Type::UINT64) == (Schema::from<List<uint64_t>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_300,local_31e + 1,local_31e);
      local_319 = false;
    }
  }
  local_356[1] = 10;
  local_352 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_356 + 1);
  _auStack_368 = (Type)Schema::from<capnp::List<float,(capnp::Kind)0>>();
  local_356[0] = ListSchema::whichElementType((ListSchema *)auStack_368);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_350,
             &local_352,local_356);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_350);
  if (!bVar1) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      local_36e[1] = 10;
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<float,(capnp::Kind)0>>();
      local_36e[0] = ListSchema::whichElementType((ListSchema *)&_kjCondition_11.result);
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xaf,ERROR,
                 "\"failed: expected \" \"(schema::Type::FLOAT32) == (Schema::from<List<float>>().whichElementType())\", _kjCondition, schema::Type::FLOAT32, Schema::from<List<float>>().whichElementType()"
                 ,(char (*) [93])
                  "failed: expected (schema::Type::FLOAT32) == (Schema::from<List<float>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_350,local_36e + 1,local_36e);
      local_369 = false;
    }
  }
  local_3a6[1] = 0xb;
  local_3a2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_3a6 + 1);
  _auStack_3b8 = (Type)Schema::from<capnp::List<double,(capnp::Kind)0>>();
  local_3a6[0] = ListSchema::whichElementType((ListSchema *)auStack_3b8);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_3a0,
             &local_3a2,local_3a6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3a0);
  if (!bVar1) {
    local_3b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3b9 != false) {
      local_3bc._0_1_ = '\v';
      local_3bc._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<double,(capnp::Kind)0>>();
      local_3be = ListSchema::whichElementType((ListSchema *)&_kjCondition_12.result);
      kj::_::Debug::
      log<char_const(&)[94],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"(schema::Type::FLOAT64) == (Schema::from<List<double>>().whichElementType())\", _kjCondition, schema::Type::FLOAT64, Schema::from<List<double>>().whichElementType()"
                 ,(char (*) [94])
                  "failed: expected (schema::Type::FLOAT64) == (Schema::from<List<double>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_3a0,&local_3bc,&local_3be);
      local_3b9 = false;
    }
  }
  local_3f4._0_1_ = '\f';
  local_3f4._1_1_ = '\0';
  local_3f2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f4);
  _auStack_408 = (Type)Schema::from<capnp::List<capnp::Text,(capnp::Kind)1>>();
  local_3f6 = ListSchema::whichElementType((ListSchema *)auStack_408);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_3f0,
             &local_3f2,&local_3f6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f0);
  if (!bVar1) {
    local_409 = kj::_::Debug::shouldLog(ERROR);
    while (local_409 != false) {
      local_40c._0_1_ = '\f';
      local_40c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<capnp::Text,(capnp::Kind)1>>();
      local_40e = ListSchema::whichElementType((ListSchema *)&_kjCondition_13.result);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb1,ERROR,
                 "\"failed: expected \" \"(schema::Type::TEXT) == (Schema::from<List<Text>>().whichElementType())\", _kjCondition, schema::Type::TEXT, Schema::from<List<Text>>().whichElementType()"
                 ,(char (*) [89])
                  "failed: expected (schema::Type::TEXT) == (Schema::from<List<Text>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_3f0,&local_40c,&local_40e);
      local_409 = false;
    }
  }
  local_444._0_1_ = '\r';
  local_444._1_1_ = '\0';
  local_442 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_444);
  _auStack_458 = (Type)Schema::from<capnp::List<capnp::Data,(capnp::Kind)1>>();
  local_446 = ListSchema::whichElementType((ListSchema *)auStack_458);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)local_440,
             &local_442,&local_446);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_440);
  func = extraout_RDX;
  if (!bVar1) {
    local_459 = kj::_::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (local_459 != false) {
      local_45c._0_1_ = '\r';
      local_45c._1_1_ = '\0';
      join_0x00000010_0x00000000_ = (Type)Schema::from<capnp::List<capnp::Data,(capnp::Kind)1>>();
      local_45e = ListSchema::whichElementType((ListSchema *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"(schema::Type::DATA) == (Schema::from<List<Data>>().whichElementType())\", _kjCondition, schema::Type::DATA, Schema::from<List<Data>>().whichElementType()"
                 ,(char (*) [89])
                  "failed: expected (schema::Type::DATA) == (Schema::from<List<Data>>().whichElementType())"
                 ,(DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                  local_440,&local_45c,&local_45e);
      func = extraout_RDX_01;
      local_459 = false;
    }
  }
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__0>
            ((Maybe<kj::Exception> *)(local_959 + 1),(kj *)local_959,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_7c0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
             (Maybe<kj::Exception> *)(local_959 + 1));
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_628,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_7c0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_7c0);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_959 + 1));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_628);
  if (!bVar1) {
    _kjCondition_15._435_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_15._435_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb4,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getStructElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [121])
                  "failed: expected kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getStructElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_628);
      _kjCondition_15._435_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_628);
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__1>
            ((Maybe<kj::Exception> *)local_e58,(kj *)&_kjCondition_16.field_0x1b7,func_00);
  kj::_::DebugExpressionStart::operator<<
            (&local_cc0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
             (Maybe<kj::Exception> *)local_e58);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_b28,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_cc0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_cc0);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_e58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b28);
  if (!bVar1) {
    _kjCondition_16._438_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_16._438_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[119],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb5,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getEnumElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [119])
                  "failed: expected kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getEnumElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_b28);
      _kjCondition_16._438_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_b28);
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__2>
            ((Maybe<kj::Exception> *)local_1348,(kj *)&_kjCondition_17.field_0x1b7,func_01);
  kj::_::DebugExpressionStart::operator<<
            (&local_11b0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
             (Maybe<kj::Exception> *)local_1348);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1018,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_11b0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_11b0);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_1348);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1018);
  if (!bVar1) {
    _kjCondition_17._438_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_17._438_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[124],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb6,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getInterfaceElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [124])
                  "failed: expected kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getInterfaceElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1018);
      _kjCondition_17._438_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1018);
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__3>
            ((Maybe<kj::Exception> *)local_1838,(kj *)((long)&schema.elementType.field_4 + 7),
             func_02);
  kj::_::DebugExpressionStart::operator<<
            (&local_16a0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
             (Maybe<kj::Exception> *)local_1838);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1508,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_16a0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_16a0);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_1838);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1508);
  if (!bVar1) {
    schema.elementType.field_4.scopeId._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while (schema.elementType.field_4.scopeId._6_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[119],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getListElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [119])
                  "failed: expected kj::runCatchingExceptions([&]() { Schema::from<List<uint16_t>>().getListElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1508);
      schema.elementType.field_4.scopeId._6_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1508);
  join_0x00000010_0x00000000_ =
       (Type)Schema::from<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>();
  local_1874._0_1_ = '\x10';
  local_1874._1_1_ = '\0';
  local_1872 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1874);
  local_1876 = ListSchema::whichElementType((ListSchema *)&_kjCondition_18.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_1870,
             &local_1872,&local_1876);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_1870);
  if (!bVar1) {
    local_1877 = kj::_::Debug::shouldLog(ERROR);
    while (local_1877 != false) {
      _kjCondition_19._38_2_ = 0x10;
      _kjCondition_19._36_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_18.result);
      kj::_::Debug::
      log<char_const(&)[71],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xbb,ERROR,
                 "\"failed: expected \" \"(schema::Type::STRUCT) == (schema.whichElementType())\", _kjCondition, schema::Type::STRUCT, schema.whichElementType()"
                 ,(char (*) [71])
                  "failed: expected (schema::Type::STRUCT) == (schema.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_1870,(Which *)&_kjCondition_19.field_0x26,
                 (Which *)&_kjCondition_19.field_0x24);
      local_1877 = false;
    }
  }
  local_18b8.raw =
       (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)&_kjCondition_18.result);
  local_18b0.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StructSchema *)&local_18b8);
  SStack_18c0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  kj::_::DebugExpression<capnp::StructSchema>::operator==
            ((DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)local_18a8,
             (DebugExpression<capnp::StructSchema> *)&local_18b0,
             (StructSchema *)&stack0xffffffffffffe740);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18a8);
  paVar2 = extraout_RDX_02;
  if (!bVar1) {
    _kjCondition_20._439_1_ = kj::_::Debug::shouldLog(ERROR);
    paVar2 = extraout_RDX_03;
    while (_kjCondition_20._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[79],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xbc,ERROR,
                 "\"failed: expected \" \"schema.getStructElementType() == Schema::from<TestAllTypes>()\", _kjCondition"
                 ,(char (*) [79])
                  "failed: expected schema.getStructElementType() == Schema::from<TestAllTypes>()",
                 (DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)local_18a8);
      paVar2 = extraout_RDX_04;
      _kjCondition_20._439_1_ = 0;
    }
  }
  _auStack_1db8 = &_kjCondition_18.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__4>
            (&local_1db0,(kj *)auStack_1db8,paVar2);
  kj::_::DebugExpressionStart::operator<<
            (&local_1c18,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1db0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1a80,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_1c18,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_1c18);
  kj::Maybe<kj::Exception>::~Maybe(&local_1db0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a80);
  if (!bVar1) {
    _kjCondition_21._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_21._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xbd,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1a80);
      _kjCondition_21._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1a80);
  _auStack_22b0 = &_kjCondition_18.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__5>
            (&local_22a8,(kj *)auStack_22b0,func_03);
  kj::_::DebugExpressionStart::operator<<
            (&local_2110,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_22a8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1f78,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_2110,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_2110);
  kj::Maybe<kj::Exception>::~Maybe(&local_22a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f78);
  if (!bVar1) {
    _kjCondition_22._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_22._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[100],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xbe,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1f78);
      _kjCondition_22._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1f78);
  _auStack_27a8 = &_kjCondition_18.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__6>
            (&local_27a0,(kj *)auStack_27a8,func_04);
  kj::_::DebugExpressionStart::operator<<
            (&local_2608,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_27a0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2470,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_2608,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_2608);
  kj::Maybe<kj::Exception>::~Maybe(&local_27a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2470);
  if (!bVar1) {
    schema_1.elementType.field_4.scopeId._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (schema_1.elementType.field_4.scopeId._7_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xbf,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getListElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getListElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2470);
      schema_1.elementType.field_4.scopeId._7_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2470);
  join_0x00000010_0x00000000_ =
       (Type)Schema::from<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,(capnp::Kind)2>>();
  local_27e4._0_1_ = '\x0f';
  local_27e4._1_1_ = '\0';
  local_27e2 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_27e4);
  local_27e6 = ListSchema::whichElementType((ListSchema *)&_kjCondition_23.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_27e0,
             &local_27e2,&local_27e6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_27e0);
  if (!bVar1) {
    local_27e7 = kj::_::Debug::shouldLog(ERROR);
    while (local_27e7 != false) {
      _kjCondition_24._38_2_ = 0xf;
      _kjCondition_24._36_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_23.result);
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xc4,ERROR,
                 "\"failed: expected \" \"(schema::Type::ENUM) == (schema.whichElementType())\", _kjCondition, schema::Type::ENUM, schema.whichElementType()"
                 ,(char (*) [69])
                  "failed: expected (schema::Type::ENUM) == (schema.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_27e0,(Which *)&_kjCondition_24.field_0x26,
                 (Which *)&_kjCondition_24.field_0x24);
      local_27e7 = false;
    }
  }
  local_2828.raw =
       (RawBrandedSchema *)ListSchema::getEnumElementType((ListSchema *)&_kjCondition_23.result);
  local_2820.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(EnumSchema *)&local_2828);
  SStack_2830.raw = (RawBrandedSchema *)Schema::from<capnp::schemas::TestEnum_9c8e9318b29d9cd3>();
  kj::_::DebugExpression<capnp::EnumSchema>::operator==
            ((DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)local_2818,
             (DebugExpression<capnp::EnumSchema> *)&local_2820,
             (EnumSchema *)&stack0xffffffffffffd7d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2818);
  paVar2 = extraout_RDX_05;
  if (!bVar1) {
    _kjCondition_25._439_1_ = kj::_::Debug::shouldLog(ERROR);
    paVar2 = extraout_RDX_06;
    while (_kjCondition_25._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xc5,ERROR,
                 "\"failed: expected \" \"schema.getEnumElementType() == Schema::from<TestEnum>()\", _kjCondition"
                 ,(char (*) [73])
                  "failed: expected schema.getEnumElementType() == Schema::from<TestEnum>()",
                 (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)local_2818);
      paVar2 = extraout_RDX_07;
      _kjCondition_25._439_1_ = 0;
    }
  }
  _auStack_2d28 = &_kjCondition_23.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__7>
            (&local_2d20,(kj *)auStack_2d28,paVar2);
  kj::_::DebugExpressionStart::operator<<
            (&local_2b88,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d20);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_29f0,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_2b88,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_2b88);
  kj::Maybe<kj::Exception>::~Maybe(&local_2d20);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_29f0);
  if (!bVar1) {
    _kjCondition_26._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_26._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[97],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xc6,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [97])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_29f0);
      _kjCondition_26._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_29f0);
  _auStack_3220 = &_kjCondition_23.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__8>
            (&local_3218,(kj *)auStack_3220,func_05);
  kj::_::DebugExpressionStart::operator<<
            (&local_3080,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3218);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2ee8,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3080,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3080);
  kj::Maybe<kj::Exception>::~Maybe(&local_3218);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2ee8);
  if (!bVar1) {
    _kjCondition_27._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_27._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[100],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,199,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2ee8);
      _kjCondition_27._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2ee8);
  _auStack_3718 = &_kjCondition_23.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__9>
            (&local_3710,(kj *)auStack_3718,func_06);
  kj::_::DebugExpressionStart::operator<<
            (&local_3578,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3710);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_33e0,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3578,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3578);
  kj::Maybe<kj::Exception>::~Maybe(&local_3710);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_33e0);
  if (!bVar1) {
    schema_2.elementType.field_4.scopeId._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (schema_2.elementType.field_4.scopeId._7_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,200,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getListElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getListElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_33e0);
      schema_2.elementType.field_4.scopeId._7_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_33e0);
  join_0x00000010_0x00000000_ =
       (Type)Schema::from<capnp::List<capnp::List<int,(capnp::Kind)0>,(capnp::Kind)6>>();
  local_3754._0_1_ = '\x0e';
  local_3754._1_1_ = '\0';
  local_3752 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3754);
  local_3756 = ListSchema::whichElementType((ListSchema *)&_kjCondition_28.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_3750,
             &local_3752,&local_3756);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_3750);
  paVar2 = extraout_RDX_08;
  if (!bVar1) {
    local_3757 = kj::_::Debug::shouldLog(ERROR);
    paVar2 = extraout_RDX_09;
    while (local_3757 != false) {
      _kjCondition_29._438_2_ = 0xe;
      _kjCondition_29._436_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_28.result);
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xcf,ERROR,
                 "\"failed: expected \" \"(schema::Type::LIST) == (schema.whichElementType())\", _kjCondition, schema::Type::LIST, schema.whichElementType()"
                 ,(char (*) [69])
                  "failed: expected (schema::Type::LIST) == (schema.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_3750,(Which *)&_kjCondition_29.field_0x1b6,
                 (Which *)&_kjCondition_29.field_0x1b4);
      paVar2 = extraout_RDX_10;
      local_3757 = false;
    }
  }
  _auStack_3c50 = &_kjCondition_28.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__10>
            (&local_3c48,(kj *)auStack_3c50,paVar2);
  kj::_::DebugExpressionStart::operator<<
            (&local_3ab0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3c48);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3918,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3ab0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3ab0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3c48);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3918);
  if (!bVar1) {
    _kjCondition_30._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_30._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[97],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xd0,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [97])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3918);
      _kjCondition_30._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3918);
  _auStack_4148 = &_kjCondition_28.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__11>
            (&local_4140,(kj *)auStack_4148,func_07);
  kj::_::DebugExpressionStart::operator<<
            (&local_3fa8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4140);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3e10,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3fa8,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3fa8);
  kj::Maybe<kj::Exception>::~Maybe(&local_4140);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e10);
  if (!bVar1) {
    _kjCondition_31._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_31._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xd1,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3e10);
      _kjCondition_31._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3e10);
  _auStack_4640 = &_kjCondition_28.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__12>
            (&local_4638,(kj *)auStack_4640,func_08);
  kj::_::DebugExpressionStart::operator<<
            (&local_44a0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4638);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4308,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_44a0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_44a0);
  kj::Maybe<kj::Exception>::~Maybe(&local_4638);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4308);
  if (!bVar1) {
    inner.elementType.field_4.scopeId._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (inner.elementType.field_4.scopeId._7_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[100],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xd2,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4308);
      inner.elementType.field_4.scopeId._7_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4308);
  join_0x00000010_0x00000000_ =
       (Type)ListSchema::getListElementType((ListSchema *)&_kjCondition_28.result);
  local_467c._0_1_ = '\x04';
  local_467c._1_1_ = '\0';
  local_467a = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_467c);
  local_467e = ListSchema::whichElementType((ListSchema *)&_kjCondition_32.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_4678,
             &local_467a,&local_467e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_4678);
  if (!bVar1) {
    local_467f = kj::_::Debug::shouldLog(ERROR);
    while (local_467f != false) {
      schema_3.elementType.field_4.scopeId._6_2_ = 4;
      schema_3.elementType.field_4.scopeId._4_2_ =
           ListSchema::whichElementType((ListSchema *)&_kjCondition_32.result);
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"(schema::Type::INT32) == (inner.whichElementType())\", _kjCondition, schema::Type::INT32, inner.whichElementType()"
                 ,(char (*) [69])
                  "failed: expected (schema::Type::INT32) == (inner.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_4678,(Which *)((long)&schema_3.elementType.field_4 + 6),
                 (Which *)((long)&schema_3.elementType.field_4 + 4));
      local_467f = false;
    }
  }
  join_0x00000010_0x00000000_ =
       (Type)Schema::
             from<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>,(capnp::Kind)6>>
                       ();
  local_46bc._0_1_ = '\x0e';
  local_46bc._1_1_ = '\0';
  local_46ba = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_46bc);
  local_46be = ListSchema::whichElementType((ListSchema *)&_kjCondition_33.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_46b8,
             &local_46ba,&local_46be);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_46b8);
  paVar2 = extraout_RDX_11;
  if (!bVar1) {
    local_46bf = kj::_::Debug::shouldLog(ERROR);
    paVar2 = extraout_RDX_12;
    while (local_46bf != false) {
      _kjCondition_34._438_2_ = 0xe;
      _kjCondition_34._436_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_33.result);
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xda,ERROR,
                 "\"failed: expected \" \"(schema::Type::LIST) == (schema.whichElementType())\", _kjCondition, schema::Type::LIST, schema.whichElementType()"
                 ,(char (*) [69])
                  "failed: expected (schema::Type::LIST) == (schema.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_46b8,(Which *)&_kjCondition_34.field_0x1b6,
                 (Which *)&_kjCondition_34.field_0x1b4);
      paVar2 = extraout_RDX_13;
      local_46bf = false;
    }
  }
  _auStack_4bb8 = &_kjCondition_33.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__13>
            (&local_4bb0,(kj *)auStack_4bb8,paVar2);
  kj::_::DebugExpressionStart::operator<<
            (&local_4a18,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4bb0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4880,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_4a18,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_4a18);
  kj::Maybe<kj::Exception>::~Maybe(&local_4bb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4880);
  if (!bVar1) {
    _kjCondition_35._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_35._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[97],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [97])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4880);
      _kjCondition_35._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4880);
  _auStack_50b0 = &_kjCondition_33.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__14>
            (&local_50a8,(kj *)auStack_50b0,func_09);
  kj::_::DebugExpressionStart::operator<<
            (&local_4f10,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50a8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4d78,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_4f10,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_4f10);
  kj::Maybe<kj::Exception>::~Maybe(&local_50a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4d78);
  if (!bVar1) {
    _kjCondition_36._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_36._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4d78);
      _kjCondition_36._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4d78);
  _auStack_55a8 = &_kjCondition_33.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__15>
            (&local_55a0,(kj *)auStack_55a8,func_10);
  kj::_::DebugExpressionStart::operator<<
            (&local_5408,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_55a0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5270,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_5408,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_5408);
  kj::Maybe<kj::Exception>::~Maybe(&local_55a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5270);
  if (!bVar1) {
    inner_1.elementType.field_4.scopeId._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (inner_1.elementType.field_4.scopeId._7_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[100],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xdd,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5270);
      inner_1.elementType.field_4.scopeId._7_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5270);
  join_0x00000010_0x00000000_ =
       (Type)ListSchema::getListElementType((ListSchema *)&_kjCondition_33.result);
  local_55e4._0_1_ = '\x10';
  local_55e4._1_1_ = '\0';
  local_55e2 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_55e4);
  local_55e6 = ListSchema::whichElementType((ListSchema *)&_kjCondition_37.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_55e0,
             &local_55e2,&local_55e6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_55e0);
  if (!bVar1) {
    local_55e7 = kj::_::Debug::shouldLog(ERROR);
    while (local_55e7 != false) {
      _kjCondition_38._38_2_ = 0x10;
      _kjCondition_38._36_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_37.result);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"(schema::Type::STRUCT) == (inner.whichElementType())\", _kjCondition, schema::Type::STRUCT, inner.whichElementType()"
                 ,(char (*) [70])
                  "failed: expected (schema::Type::STRUCT) == (inner.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_55e0,(Which *)&_kjCondition_38.field_0x26,
                 (Which *)&_kjCondition_38.field_0x24);
      local_55e7 = false;
    }
  }
  local_5628.raw =
       (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)&_kjCondition_37.result);
  local_5620.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StructSchema *)&local_5628);
  SStack_5630.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  kj::_::DebugExpression<capnp::StructSchema>::operator==
            ((DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)local_5618,
             (DebugExpression<capnp::StructSchema> *)&local_5620,
             (StructSchema *)&stack0xffffffffffffa9d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5618);
  if (!bVar1) {
    schema_4.elementType.field_4.scopeId._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (schema_4.elementType.field_4.scopeId._7_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[78],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"inner.getStructElementType() == Schema::from<TestAllTypes>()\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected inner.getStructElementType() == Schema::from<TestAllTypes>()",
                 (DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)local_5618);
      schema_4.elementType.field_4.scopeId._7_1_ = 0;
    }
  }
  join_0x00000010_0x00000000_ =
       (Type)Schema::
             from<capnp::List<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,(capnp::Kind)2>,(capnp::Kind)6>>
                       ();
  local_566c._0_1_ = '\x0e';
  local_566c._1_1_ = '\0';
  local_566a = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_566c);
  local_566e = ListSchema::whichElementType((ListSchema *)&_kjCondition_39.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_5668,
             &local_566a,&local_566e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_5668);
  paVar2 = extraout_RDX_14;
  if (!bVar1) {
    local_566f = kj::_::Debug::shouldLog(ERROR);
    paVar2 = extraout_RDX_15;
    while (local_566f != false) {
      _kjCondition_40._438_2_ = 0xe;
      _kjCondition_40._436_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_39.result);
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"(schema::Type::LIST) == (schema.whichElementType())\", _kjCondition, schema::Type::LIST, schema.whichElementType()"
                 ,(char (*) [69])
                  "failed: expected (schema::Type::LIST) == (schema.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_5668,(Which *)&_kjCondition_40.field_0x1b6,
                 (Which *)&_kjCondition_40.field_0x1b4);
      paVar2 = extraout_RDX_16;
      local_566f = false;
    }
  }
  _auStack_5b68 = &_kjCondition_39.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__16>
            (&local_5b60,(kj *)auStack_5b68,paVar2);
  kj::_::DebugExpressionStart::operator<<
            (&local_59c8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5b60);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5830,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_59c8,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_59c8);
  kj::Maybe<kj::Exception>::~Maybe(&local_5b60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5830);
  if (!bVar1) {
    _kjCondition_41._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_41._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[97],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xe7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [97])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getStructElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5830);
      _kjCondition_41._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5830);
  _auStack_6060 = &_kjCondition_39.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__17>
            (&local_6058,(kj *)auStack_6060,func_11);
  kj::_::DebugExpressionStart::operator<<
            (&local_5ec0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_6058);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5d28,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_5ec0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_5ec0);
  kj::Maybe<kj::Exception>::~Maybe(&local_6058);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5d28);
  if (!bVar1) {
    _kjCondition_42._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_42._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xe8,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getEnumElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5d28);
      _kjCondition_42._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_5d28);
  _auStack_6558 = &_kjCondition_39.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase164::run()::__18>
            (&local_6550,(kj *)auStack_6558,func_12);
  kj::_::DebugExpressionStart::operator<<
            (&local_63b8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_6550);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_6220,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_63b8,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_63b8);
  kj::Maybe<kj::Exception>::~Maybe(&local_6550);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6220);
  if (!bVar1) {
    inner_2.elementType.field_4.scopeId._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (inner_2.elementType.field_4.scopeId._7_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[100],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xe9,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getInterfaceElementType(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_6220);
      inner_2.elementType.field_4.scopeId._7_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_6220);
  join_0x00000010_0x00000000_ =
       (Type)ListSchema::getListElementType((ListSchema *)&_kjCondition_39.result);
  local_6596[1] = 0xf;
  local_6592 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_6596 + 1);
  local_6596[0] = ListSchema::whichElementType((ListSchema *)&_kjCondition_43.result);
  kj::_::DebugExpression<capnp::schema::Type::Which>::operator==
            ((DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)&local_6590,
             &local_6592,local_6596);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_6590);
  if (!bVar1) {
    local_6597 = kj::_::Debug::shouldLog(ERROR);
    while (local_6597 != false) {
      _kjCondition_44._38_2_ = 0xf;
      _kjCondition_44._36_2_ = ListSchema::whichElementType((ListSchema *)&_kjCondition_43.result);
      kj::_::Debug::
      log<char_const(&)[68],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(schema::Type::ENUM) == (inner.whichElementType())\", _kjCondition, schema::Type::ENUM, inner.whichElementType()"
                 ,(char (*) [68])
                  "failed: expected (schema::Type::ENUM) == (inner.whichElementType())",
                 (DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *)
                 &local_6590,(Which *)&_kjCondition_44.field_0x26,
                 (Which *)&_kjCondition_44.field_0x24);
      local_6597 = false;
    }
  }
  local_65d8.raw =
       (RawBrandedSchema *)ListSchema::getEnumElementType((ListSchema *)&_kjCondition_43.result);
  local_65d0.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(EnumSchema *)&local_65d8);
  SStack_65e0.raw = (RawBrandedSchema *)Schema::from<capnp::schemas::TestEnum_9c8e9318b29d9cd3>();
  kj::_::DebugExpression<capnp::EnumSchema>::operator==
            ((DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)local_65c8,
             (DebugExpression<capnp::EnumSchema> *)&local_65d0,
             (EnumSchema *)&stack0xffffffffffff9a20);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_65c8);
  if (!bVar1) {
    local_65e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_65e1 != false) {
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"inner.getEnumElementType() == Schema::from<TestEnum>()\", _kjCondition"
                 ,(char (*) [72])
                  "failed: expected inner.getEnumElementType() == Schema::from<TestEnum>()",
                 (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)local_65c8);
      local_65e1 = false;
    }
  }
  return;
}

Assistant:

TEST(Schema, Lists) {
  EXPECT_EQ(schema::Type::VOID, Schema::from<List<Void>>().whichElementType());
  EXPECT_EQ(schema::Type::BOOL, Schema::from<List<bool>>().whichElementType());
  EXPECT_EQ(schema::Type::INT8, Schema::from<List<int8_t>>().whichElementType());
  EXPECT_EQ(schema::Type::INT16, Schema::from<List<int16_t>>().whichElementType());
  EXPECT_EQ(schema::Type::INT32, Schema::from<List<int32_t>>().whichElementType());
  EXPECT_EQ(schema::Type::INT64, Schema::from<List<int64_t>>().whichElementType());
  EXPECT_EQ(schema::Type::UINT8, Schema::from<List<uint8_t>>().whichElementType());
  EXPECT_EQ(schema::Type::UINT16, Schema::from<List<uint16_t>>().whichElementType());
  EXPECT_EQ(schema::Type::UINT32, Schema::from<List<uint32_t>>().whichElementType());
  EXPECT_EQ(schema::Type::UINT64, Schema::from<List<uint64_t>>().whichElementType());
  EXPECT_EQ(schema::Type::FLOAT32, Schema::from<List<float>>().whichElementType());
  EXPECT_EQ(schema::Type::FLOAT64, Schema::from<List<double>>().whichElementType());
  EXPECT_EQ(schema::Type::TEXT, Schema::from<List<Text>>().whichElementType());
  EXPECT_EQ(schema::Type::DATA, Schema::from<List<Data>>().whichElementType());

  EXPECT_NONFATAL_FAILURE(Schema::from<List<uint16_t>>().getStructElementType());
  EXPECT_NONFATAL_FAILURE(Schema::from<List<uint16_t>>().getEnumElementType());
  EXPECT_NONFATAL_FAILURE(Schema::from<List<uint16_t>>().getInterfaceElementType());
  EXPECT_NONFATAL_FAILURE(Schema::from<List<uint16_t>>().getListElementType());

  {
    ListSchema schema = Schema::from<List<TestAllTypes>>();
    EXPECT_EQ(schema::Type::STRUCT, schema.whichElementType());
    EXPECT_TRUE(schema.getStructElementType() == Schema::from<TestAllTypes>());
    EXPECT_NONFATAL_FAILURE(schema.getEnumElementType());
    EXPECT_NONFATAL_FAILURE(schema.getInterfaceElementType());
    EXPECT_NONFATAL_FAILURE(schema.getListElementType());
  }

  {
    ListSchema schema = Schema::from<List<TestEnum>>();
    EXPECT_EQ(schema::Type::ENUM, schema.whichElementType());
    EXPECT_TRUE(schema.getEnumElementType() == Schema::from<TestEnum>());
    EXPECT_NONFATAL_FAILURE(schema.getStructElementType());
    EXPECT_NONFATAL_FAILURE(schema.getInterfaceElementType());
    EXPECT_NONFATAL_FAILURE(schema.getListElementType());
  }

  // TODO(someday):  Test interfaces.

  {
    ListSchema schema = Schema::from<List<List<int32_t>>>();
    EXPECT_EQ(schema::Type::LIST, schema.whichElementType());
    EXPECT_NONFATAL_FAILURE(schema.getStructElementType());
    EXPECT_NONFATAL_FAILURE(schema.getEnumElementType());
    EXPECT_NONFATAL_FAILURE(schema.getInterfaceElementType());

    ListSchema inner = schema.getListElementType();
    EXPECT_EQ(schema::Type::INT32, inner.whichElementType());
  }

  {
    ListSchema schema = Schema::from<List<List<TestAllTypes>>>();
    EXPECT_EQ(schema::Type::LIST, schema.whichElementType());
    EXPECT_NONFATAL_FAILURE(schema.getStructElementType());
    EXPECT_NONFATAL_FAILURE(schema.getEnumElementType());
    EXPECT_NONFATAL_FAILURE(schema.getInterfaceElementType());

    ListSchema inner = schema.getListElementType();
    EXPECT_EQ(schema::Type::STRUCT, inner.whichElementType());
    EXPECT_TRUE(inner.getStructElementType() == Schema::from<TestAllTypes>());
  }

  {
    ListSchema schema = Schema::from<List<List<TestEnum>>>();
    EXPECT_EQ(schema::Type::LIST, schema.whichElementType());
    EXPECT_NONFATAL_FAILURE(schema.getStructElementType());
    EXPECT_NONFATAL_FAILURE(schema.getEnumElementType());
    EXPECT_NONFATAL_FAILURE(schema.getInterfaceElementType());

    ListSchema inner = schema.getListElementType();
    EXPECT_EQ(schema::Type::ENUM, inner.whichElementType());
    EXPECT_TRUE(inner.getEnumElementType() == Schema::from<TestEnum>());
  }
}